

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O3

void __thiscall
ktxValidator::validateDxgiFormat
          (ktxValidator *this,validationContext *param_1,char *key,uint8_t *param_3,
          uint32_t valueLen)

{
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  if (valueLen != 4) {
    local_40._0_4_ = Metadata.InvalidValue.code;
    local_38._M_p = (pointer)&local_28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,Metadata.InvalidValue.message._M_dataplus._M_p,
               Metadata.InvalidValue.message._M_dataplus._M_p +
               Metadata.InvalidValue.message._M_string_length);
    addIssue<char_const*>(this,eError,(issue *)local_40,key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_p != &local_28) {
      operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void
ktxValidator::validateDxgiFormat(validationContext& /*ctx*/,
                                 const char* key,
                                 const uint8_t* /*value*/,
                                 uint32_t valueLen)
                            {
    if (valueLen != sizeof(uint32_t))
        addIssue(logger::eError, Metadata.InvalidValue, key);}